

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::setMuxFormat(TSMuxer *this,string *format)

{
  bool bVar1;
  undefined4 uVar2;
  uint8_t *puVar3;
  long lVar4;
  int iVar5;
  
  bVar1 = std::operator==(format,"M2TS");
  if (bVar1) {
LAB_001e13e5:
    this->m_m2tsMode = true;
    this->m_writeBlockSize = 0x200000;
    puVar3 = (uint8_t *)operator_new__(0x200400);
    this->m_outBuf = puVar3;
  }
  else {
    bVar1 = std::operator==(format,"M2T");
    if (bVar1) goto LAB_001e13e5;
    bVar1 = std::operator==(format,"MTS");
    if (bVar1) goto LAB_001e13e5;
    bVar1 = std::operator==(format,"SSIF");
    this->m_m2tsMode = bVar1;
    iVar5 = 0x1ffff4;
    if (bVar1) {
      iVar5 = 0x200000;
    }
    this->m_writeBlockSize = iVar5;
    puVar3 = (uint8_t *)operator_new__((ulong)(iVar5 + 0x400));
    this->m_outBuf = puVar3;
    if (!bVar1) {
      uVar2 = 0xbc;
      lVar4 = 0x149c;
      goto LAB_001e1416;
    }
  }
  this->m_frameSize = 0xc0;
  uVar2 = 0x1800;
  lVar4 = 0x34;
LAB_001e1416:
  *(undefined4 *)((long)&(this->super_AbstractMuxer)._vptr_AbstractMuxer + lVar4) = uVar2;
  return;
}

Assistant:

void TSMuxer::setMuxFormat(const std::string& format)
{
    m_m2tsMode = format == "M2TS" || format == "M2T" || format == "MTS" || format == "SSIF";
    m_writeBlockSize = m_m2tsMode ? DEFAULT_FILE_BLOCK_SIZE : TS188_ROUND_BLOCK_SIZE;
    m_outBuf = new uint8_t[m_writeBlockSize + 1024];
    m_frameSize = m_m2tsMode ? 192 : 188;
    if (m_m2tsMode)
        m_sectorSize = 1024 * 6;
}